

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

UBool __thiscall
icu_63::StringTrieBuilder::IntermediateValueNode::operator==
          (IntermediateValueNode *this,Node *other)

{
  UBool UVar1;
  bool bVar2;
  
  if (this != (IntermediateValueNode *)other) {
    UVar1 = ValueNode::operator==(&this->super_ValueNode,other);
    if (UVar1 == '\0') {
      bVar2 = false;
    }
    else {
      bVar2 = this->next == *(Node **)&other[1].hash;
    }
    return bVar2;
  }
  return '\x01';
}

Assistant:

UBool
StringTrieBuilder::IntermediateValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!ValueNode::operator==(other)) {
        return FALSE;
    }
    const IntermediateValueNode &o=(const IntermediateValueNode &)other;
    return next==o.next;
}